

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

Aig_Obj_t *
Saig_StrSimTableLookup(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAStack_38;
  int iEntry;
  Aig_Obj_t *pEntry;
  Aig_Obj_t *pObj_local;
  int nTableSize_local;
  Aig_Obj_t **ppNexts_local;
  Aig_Obj_t **ppTable_local;
  
  uVar1 = Saig_StrSimHash(pObj);
  pAStack_38 = ppTable[(int)(uVar1 % (uint)nTableSize)];
  while( true ) {
    if (pAStack_38 == (Aig_Obj_t *)0x0) {
      return (Aig_Obj_t *)0x0;
    }
    iVar2 = Saig_StrSimIsEqual(pAStack_38,pObj);
    if (iVar2 != 0) break;
    pAStack_38 = Saig_ObjNext(ppNexts,pAStack_38);
  }
  return pAStack_38;
}

Assistant:

Aig_Obj_t * Saig_StrSimTableLookup( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pEntry;
    int iEntry;
    // find the hash entry
    iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    for ( pEntry = ppTable[iEntry]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
        if ( Saig_StrSimIsEqual( pEntry, pObj ) )
            return pEntry;
    return NULL;
}